

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_> *
QHashPrivate::Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::detached(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
           *d,size_t size)

{
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_> *this;
  
  this = (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
          *)operator_new(0x28);
  if (d == (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
            *)0x0) {
    Data((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> *)
         this,size);
  }
  else {
    Data((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> *)
         this,d,size);
    if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (d->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (d->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        ~Data((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
               *)d);
        operator_delete(d,0x28);
      }
    }
  }
  return this;
}

Assistant:

static Data *detached(Data *d, size_t size)
    {
        if (!d)
            return new Data(size);
        Data *dd = new Data(*d, size);
        if (!d->ref.deref())
            delete d;
        return dd;
    }